

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

QByteArray * __thiscall QByteArray::append(QByteArray *this,char ch)

{
  long lVar1;
  
  QArrayDataPointer<char>::detachAndGrow
            (&this->d,GrowsAtEnd,1,(char **)0x0,(QArrayDataPointer<char> *)0x0);
  lVar1 = (this->d).size;
  (this->d).size = lVar1 + 1;
  (this->d).ptr[lVar1] = ch;
  (this->d).ptr[(this->d).size] = '\0';
  return this;
}

Assistant:

QByteArray& QByteArray::append(char ch)
{
    d.detachAndGrow(QArrayData::GrowsAtEnd, 1, nullptr, nullptr);
    d->copyAppend(1, ch);
    d.data()[d.size] = '\0';
    return *this;
}